

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

void ObsGetLastMove(pyhanabi_observation_t *observation,int index,pyhanabi_history_item_t *item)

{
  void *pvVar1;
  HanabiMove HVar2;
  HanabiMove *pHVar3;
  const_reference pvVar4;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x2e6,
                  "void ObsGetLastMove(pyhanabi_observation_t *, int, pyhanabi_history_item_t *)");
  }
  pvVar1 = observation->observation;
  if (pvVar1 != (void *)0x0) {
    if (item != (pyhanabi_history_item_t *)0x0) {
      pHVar3 = (HanabiMove *)operator_new(0x10);
      pvVar4 = std::
               vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
               ::at((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
                     *)((long)pvVar1 + 0x58),(long)index);
      HVar2 = *(HanabiMove *)&pvVar4->player;
      *pHVar3 = pvVar4->move;
      pHVar3[1] = HVar2;
      item->item = pHVar3;
      return;
    }
    __assert_fail("item != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x2e8,
                  "void ObsGetLastMove(pyhanabi_observation_t *, int, pyhanabi_history_item_t *)");
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x2e7,
                "void ObsGetLastMove(pyhanabi_observation_t *, int, pyhanabi_history_item_t *)");
}

Assistant:

void ObsGetLastMove(pyhanabi_observation_t* observation, int index,
                    pyhanabi_history_item_t* item) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(item != nullptr);
  item->item = new hanabi_learning_env::HanabiHistoryItem(
      reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
          observation->observation)
          ->LastMoves()
          .at(index));
}